

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion.cpp
# Opt level: O0

void __thiscall
iu_DISABLED_TestFailure_x_iutest_x_GE_Test::Body(iu_DISABLED_TestFailure_x_iutest_x_GE_Test *this)

{
  bool bVar1;
  char *message;
  float *in_R9;
  AssertionHelper local_208;
  Fixed local_1d8;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  float b;
  float a;
  iu_DISABLED_TestFailure_x_iutest_x_GE_Test *this_local;
  
  iutest_ar._36_4_ = 0x3dcccccd;
  iutest_ar.m_result = false;
  iutest_ar._33_3_ = 0x3f8000;
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperGE<float,float>
            ((AssertionResult *)local_40,(internal *)0x32d26e,"b",&iutest_ar.field_0x24,
             (float *)&iutest_ar.m_result,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    message = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/assertion.cpp"
               ,0x13f,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return;
}

Assistant:

IUTEST(DISABLED_TestFailure, GE)
{
    float a = 0.1f, b = 1.0f;
    IUTEST_ASSERT_GE(a, b);
}